

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O2

int __thiscall
OB::Parg::parse_args
          (Parg *this,int _argc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *_argv)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
  *this_01;
  string *this_02;
  string *psVar1;
  bool bVar2;
  reference __rhs;
  char *pcVar3;
  long lVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  int iVar9;
  int iVar10;
  string *this_03;
  bool bVar11;
  ulong uVar12;
  string a;
  string c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Base_ptr local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _Base_ptr local_38;
  
  if (_argc < 1) {
    iVar10 = 1;
  }
  else {
    this_00 = &this->flags_;
    local_60 = &(this->flags_)._M_t._M_impl.super__Rb_tree_header._M_header;
    this_01 = &this->data_;
    this_02 = &this->error_;
    psVar1 = &this->positional_;
    local_38 = &(this->data_)._M_t._M_impl.super__Rb_tree_header._M_header;
    bVar11 = false;
    for (iVar10 = 0; iVar10 < _argc; iVar10 = iVar10 + 1) {
      __rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(_argv,(long)iVar10);
      if (bVar11) {
        if ((this->positional_)._M_string_length == 0) {
          std::__cxx11::string::append((string *)psVar1);
        }
        else {
          std::operator+(&c," ",__rhs);
          std::__cxx11::string::append((string *)psVar1);
          std::__cxx11::string::~string((string *)&c);
        }
        bVar11 = true;
      }
      else {
        uVar12 = __rhs->_M_string_length;
        if (uVar12 < 2) goto LAB_001098db;
        pcVar3 = (char *)std::__cxx11::string::at((ulong)__rhs);
        iVar9 = iVar10;
        if ((*pcVar3 != '-') ||
           (pcVar3 = (char *)std::__cxx11::string::at((ulong)__rhs), *pcVar3 == '-')) {
          uVar12 = __rhs->_M_string_length;
          if (2 < uVar12) {
            pcVar3 = (char *)std::__cxx11::string::at((ulong)__rhs);
            if ((*pcVar3 == '-') &&
               (pcVar3 = (char *)std::__cxx11::string::at((ulong)__rhs), *pcVar3 == '-')) {
              std::__cxx11::string::substr((ulong)&c,(ulong)__rhs);
              a._M_dataplus._M_p = (pointer)&a.field_2;
              a._M_string_length = 0;
              a.field_2._M_local_buf[0] = '\0';
              lVar4 = std::__cxx11::string::find((char *)&c,0x12131d);
              if (lVar4 != -1) {
                std::__cxx11::string::substr((ulong)&local_80,(ulong)__rhs);
                std::__cxx11::string::operator=((string *)&c,(string *)&local_80);
                std::__cxx11::string::~string((string *)&local_80);
                std::__cxx11::string::substr((ulong)&local_80,(ulong)__rhs);
                std::__cxx11::string::operator=((string *)&a,(string *)&local_80);
                std::__cxx11::string::~string((string *)&local_80);
              }
              iVar5 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                      ::find(&this_01->_M_t,&c);
              if (iVar5._M_node == local_38) {
                std::operator+(&local_58,"invalid option \'",__rhs);
                std::operator+(&local_80,&local_58,"\'");
                std::__cxx11::string::operator=((string *)this_02,(string *)&local_80);
                std::__cxx11::string::~string((string *)&local_80);
LAB_00109c8f:
                std::__cxx11::string::~string((string *)&local_58);
                bVar11 = false;
                iVar9 = iVar10;
              }
              else {
                pmVar6 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_01,&c);
                if (pmVar6->seen_ == true) {
                  std::operator+(&local_58,"option \'--",&c);
                  std::operator+(&local_80,&local_58,"\' has already been seen");
LAB_001098a5:
                  std::__cxx11::string::operator=((string *)this_02,(string *)&local_80);
                  std::__cxx11::string::~string((string *)&local_80);
                  goto LAB_00109c8f;
                }
                pmVar6 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_01,&c);
                if (pmVar6->mode_ == true) {
                  if (a._M_string_length != 0) goto LAB_00109d6c;
                  pmVar6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_01,&c);
                  std::__cxx11::string::assign((char *)&pmVar6->value_);
                  pmVar6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_01,&c);
LAB_00109d95:
                  pmVar6->seen_ = true;
                  bVar11 = true;
                }
                else {
                  if (a._M_string_length != 0) {
LAB_00109d6c:
                    pmVar6 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                             ::at(this_01,&c);
                    std::__cxx11::string::_M_assign((string *)&pmVar6->value_);
                    pmVar6 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                             ::at(this_01,&c);
                    goto LAB_00109d95;
                  }
                  iVar9 = iVar10 + 1;
                  if (_argc <= iVar9) {
                    std::operator+(&local_58,"option \'--",&c);
                    std::operator+(&local_80,&local_58,"\' requires an arg");
                    goto LAB_001098a5;
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at(_argv,(long)iVar9);
                  pmVar6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_01,&c);
                  std::__cxx11::string::_M_assign((string *)&pmVar6->value_);
                  pmVar6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_01,&c);
                  pmVar6->seen_ = true;
                  bVar11 = true;
                }
              }
              std::__cxx11::string::~string((string *)&a);
              goto LAB_00109e6c;
            }
            uVar12 = __rhs->_M_string_length;
          }
LAB_001098db:
          if ((uVar12 == 0) || (this->is_positional_ != true)) {
            std::operator+(&a,"no match for \'",__rhs);
            std::operator+(&c,&a,"\'");
            std::__cxx11::string::operator=((string *)this_02,(string *)&c);
            std::__cxx11::string::~string((string *)&c);
            std::__cxx11::string::~string((string *)&a);
            return -1;
          }
          bVar2 = std::operator==(__rhs,"--");
          bVar11 = true;
          if (!bVar2) {
            if ((this->positional_)._M_string_length == 0) {
              std::__cxx11::string::append((string *)psVar1);
            }
            else {
              std::operator+(&c," ",__rhs);
              std::__cxx11::string::append((string *)psVar1);
              std::__cxx11::string::~string((string *)&c);
            }
            bVar11 = false;
          }
          goto LAB_00109e84;
        }
        pcVar3 = (char *)std::__cxx11::string::at((ulong)__rhs);
        c.field_2._M_local_buf[0] = *pcVar3;
        c._M_dataplus._M_p = (pointer)&c.field_2;
        c._M_string_length = 1;
        c.field_2._M_local_buf[1] = '\0';
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&this_00->_M_t,&c);
        if (iVar7._M_node == local_60) {
LAB_001099b7:
          for (uVar12 = 1; uVar12 < __rhs->_M_string_length; uVar12 = uVar12 + 1) {
            pcVar3 = (char *)std::__cxx11::string::at((ulong)__rhs);
            a.field_2._M_local_buf[0] = *pcVar3;
            a._M_dataplus._M_p = (pointer)&a.field_2;
            a._M_string_length = 1;
            a.field_2._M_local_buf[1] = '\0';
            iVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::find(&this_00->_M_t,&a);
            if (iVar7._M_node == local_60) {
LAB_00109aa2:
              std::operator+(&local_58,"invalid flag \'",__rhs);
              std::operator+(&local_80,&local_58,"\'");
              std::__cxx11::string::operator=((string *)this_02,(string *)&local_80);
              std::__cxx11::string::~string((string *)&local_80);
LAB_00109b90:
              std::__cxx11::string::~string((string *)&local_58);
              this_03 = &a;
              goto LAB_00109df5;
            }
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at(this_00,&a);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                     ::at(this_01,pmVar8);
            if (pmVar6->mode_ != true) goto LAB_00109aa2;
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at(this_00,&a);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                     ::at(this_01,pmVar8);
            if (pmVar6->seen_ == true) {
              std::operator+(&local_58,"flag \'-",&a);
              std::operator+(&local_80,&local_58,"\' has already been seen");
              std::__cxx11::string::operator=((string *)this_02,(string *)&local_80);
              std::__cxx11::string::~string((string *)&local_80);
              goto LAB_00109b90;
            }
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at(this_00,&a);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                     ::at(this_01,pmVar8);
            std::__cxx11::string::assign((char *)&pmVar6->value_);
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at(this_00,&a);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                     ::at(this_01,pmVar8);
            pmVar6->seen_ = true;
            std::__cxx11::string::~string((string *)&a);
          }
LAB_00109e67:
          bVar11 = true;
        }
        else {
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::at(this_00,&c);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                   ::at(this_01,pmVar8);
          if (pmVar6->mode_ == true) goto LAB_001099b7;
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::at(this_00,&c);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                   ::at(this_01,pmVar8);
          if (pmVar6->seen_ != true) {
            if (__rhs->_M_string_length < 3) {
LAB_00109cf6:
              iVar9 = iVar10 + 1;
              if (_argc <= iVar9) {
                std::operator+(&local_80,"flag \'-",&c);
                std::operator+(&a,&local_80,"\' requires an arg");
                goto LAB_00109ddd;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(_argv,(long)iVar9);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::at(this_00,&c);
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_01,pmVar8);
              std::__cxx11::string::_M_assign((string *)&pmVar6->value_);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::at(this_00,&c);
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_01,pmVar8);
              pmVar6->seen_ = true;
              bVar11 = true;
              goto LAB_00109e6c;
            }
            pcVar3 = (char *)std::__cxx11::string::at((ulong)__rhs);
            if (*pcVar3 == '=') {
              if ((__rhs->_M_string_length < 4) ||
                 (pcVar3 = (char *)std::__cxx11::string::at((ulong)__rhs), *pcVar3 != '='))
              goto LAB_00109cf6;
              std::__cxx11::string::substr((ulong)&a,(ulong)__rhs);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::at(this_00,&c);
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_01,pmVar8);
              std::__cxx11::string::operator=((string *)&pmVar6->value_,(string *)&a);
              std::__cxx11::string::~string((string *)&a);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::at(this_00,&c);
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_01,pmVar8);
            }
            else {
              std::__cxx11::string::substr((ulong)&a,(ulong)__rhs);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::at(this_00,&c);
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_01,pmVar8);
              std::__cxx11::string::operator=((string *)&pmVar6->value_,(string *)&a);
              std::__cxx11::string::~string((string *)&a);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::at(this_00,&c);
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_01,pmVar8);
            }
            pmVar6->seen_ = true;
            goto LAB_00109e67;
          }
          std::operator+(&local_80,"flag \'-",&c);
          std::operator+(&a,&local_80,"\' has already been seen");
LAB_00109ddd:
          this_03 = &local_80;
          std::__cxx11::string::operator=((string *)this_02,(string *)&a);
          std::__cxx11::string::~string((string *)&a);
LAB_00109df5:
          std::__cxx11::string::~string((string *)this_03);
          bVar11 = false;
          iVar9 = iVar10;
        }
LAB_00109e6c:
        std::__cxx11::string::~string((string *)&c);
        if (!bVar11) break;
        bVar11 = false;
        iVar10 = iVar9;
      }
LAB_00109e84:
    }
    iVar10 = -(uint)(iVar10 < _argc);
  }
  return iVar10;
}

Assistant:

int parse_args(int _argc, std::vector<std::string> _argv)
  {
    if (_argc < 1) return 1;

    bool dashdash {false};

    // loop through arg vector
    for (int i = 0; i < _argc; ++i)
    {
      std::string const& tmp {_argv.at(static_cast<size_t>(i))};
      // std::cout << "ARG: " << i << " -> " << tmp << std::endl;

      if (dashdash)
      {
        if (positional_.size() == 0)
        {
          positional_.append(tmp);
        }
        else
        {
          positional_.append(" " + tmp);
        }
        continue;
      }

      if (tmp.size() > 1 && tmp.at(0) == '-' && tmp.at(1) != '-')
      {
        // short
        // std::cout << "SHORT: " << tmp << std::endl;

        std::string c {tmp.at(1)};
        if (flags_.find(c) != flags_.end() && !(data_.at(flags_.at(c)).mode_))
        {
          // short arg
          // std::cout << "SHORT: arg -> " << c << std::endl;

          if (data_.at(flags_.at(c)).seen_)
          {
            // error
            error_ = "flag '-" + c + "' has already been seen";
            return -1;
          }

          if (tmp.size() > 2 && tmp.at(2) != '=')
          {
            data_.at(flags_.at(c)).value_ = tmp.substr(2, tmp.size() - 1);
            data_.at(flags_.at(c)).seen_ = true;
          }
          else if (tmp.size() > 3 && tmp.at(2) == '=')
          {
            data_.at(flags_.at(c)).value_ = tmp.substr(3, tmp.size() - 1);
            data_.at(flags_.at(c)).seen_ = true;
          }
          else if (i + 1 < _argc)
          {
            data_.at(flags_.at(c)).value_ = _argv.at(static_cast<size_t>(i + 1));
            data_.at(flags_.at(c)).seen_ = true;
            ++i;
          }
          else
          {
            // error
            error_ = "flag '-" + c + "' requires an arg";
            return -1;
          }
        }
        else
        {
          // short mode
          for (size_t j = 1; j < tmp.size(); ++j)
          {
            std::string s {tmp.at(j)};

            if (flags_.find(s) != flags_.end() && data_.at(flags_.at(s)).mode_)
            {
              // std::cout << "SHORT: mode -> " << c << std::endl;

              if (data_.at(flags_.at(s)).seen_)
              {
                // error
                error_ = "flag '-" + s + "' has already been seen";
                return -1;
              }

              data_.at(flags_.at(s)).value_ = "1";
              data_.at(flags_.at(s)).seen_ = true;
            }
            else
            {
              // error
              error_ = "invalid flag '" + tmp + "'";
              return -1;
            }
          }
        }
      }
      else if (tmp.size() > 2 && tmp.at(0) == '-' && tmp.at(1) == '-')
      {
        // long || --
        // std::cout << "LONG: " << tmp << std::endl;
        std::string c {tmp.substr(2, tmp.size() - 1)};
        std::string a;

        auto const delim = c.find("=");
        if (delim != std::string::npos)
        {
          c = tmp.substr(2, delim);
          a = tmp.substr(3 + delim, tmp.size() - 1);
        }

        if (data_.find(c) != data_.end())
        {
          if (data_.at(c).seen_)
          {
            // error
            error_ = "option '--" + c + "' has already been seen";
            return -1;
          }

          if (data_.at(c).mode_ && a.size() == 0)
          {
            // std::cout << "LONG: mode -> " << c << std::endl;
            data_.at(c).value_ = "1";
            data_.at(c).seen_ = true;
          }
          else
          {
            // std::cout << "LONG: arg -> " << c << std::endl;
            if (a.size() > 0)
            {
              data_.at(c).value_ = a;
              data_.at(c).seen_ = true;
            }
            else if (i + 1 < _argc)
            {
              data_.at(c).value_ = _argv.at(static_cast<size_t>(i + 1));
              data_.at(c).seen_ = true;
              ++i;
            }
            else
            {
              // error
              error_ = "option '--" + c + "' requires an arg";
              return -1;
            }
          }
        }
        else
        {
          // error
          error_ = "invalid option '" + tmp + "'";
          return -1;
        }
      }
      else if (tmp.size() > 0 && is_positional_)
      {
        // positional
        // std::cout << "POS: " << tmp << std::endl;
        if (tmp == "--")
        {
          dashdash = true;
        }
        else
        {
          if (positional_.size() == 0)
          {
            positional_.append(tmp);
          }
          else
          {
            positional_.append(" " + tmp);
          }
        }
      }
      else
      {
        // error
        error_ = "no match for '" + tmp + "'";
        return -1;
      }
    }

    return 0;
  }